

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLine.cpp
# Opt level: O0

void __thiscall anon_unknown.dwarf_1c6cb7::HelpPrinter::printHelp(HelpPrinter *this)

{
  StringRef *pSVar1;
  void *pvVar2;
  Option *pOVar3;
  char *pcVar4;
  StringRef Str;
  bool bVar5;
  CommandLineParser *pCVar6;
  SubCommand *this_00;
  SmallVector<llvm::cl::Option_*,_4U> *this_01;
  raw_ostream *prVar7;
  SubCommand *pSVar8;
  size_t sVar9;
  size_t sVar10;
  unsigned_long *puVar11;
  reference pSVar12;
  StringRef I;
  iterator __end2_1;
  iterator __begin2_1;
  vector<llvm::StringRef,_std::allocator<llvm::StringRef>_> *__range2_1;
  size_t local_1180;
  size_t e_1;
  size_t i_1;
  size_t MaxArgLen;
  size_t local_1160;
  size_t e;
  size_t i;
  size_t MaxSubLen;
  size_t local_1140;
  char *local_1138;
  size_t local_1130;
  char *local_1128;
  size_t local_1120;
  Option *local_1118;
  Option *Opt;
  iterator __end2;
  iterator __begin2;
  SmallVector<llvm::cl::Option_*,_4U> *__range2;
  StringRef local_10e8;
  StringRef local_10d8;
  StringRef local_10c8;
  char *local_10b8;
  size_t local_10b0;
  undefined1 local_10a8 [8];
  StrSubCommandPairVector Subs;
  StrOptionPairVector Opts;
  Option **ConsumeAfterOpt;
  SmallVector<llvm::cl::Option_*,_4U> *PositionalOpts;
  StringMap<llvm::cl::Option_*,_llvm::MallocAllocator> *OptionsMap;
  SubCommand *Sub;
  HelpPrinter *this_local;
  
  pCVar6 = llvm::
           ManagedStatic<(anonymous_namespace)::CommandLineParser,_llvm::object_creator<(anonymous_namespace)::CommandLineParser>,_llvm::object_deleter<(anonymous_namespace)::CommandLineParser>_>
           ::operator->(&GlobalParser);
  this_00 = CommandLineParser::getActiveSubCommand(pCVar6);
  this_01 = &this_00->PositionalOpts;
  llvm::SmallVector<std::pair<const_char_*,_llvm::cl::Option_*>,_128U>::SmallVector
            ((SmallVector<std::pair<const_char_*,_llvm::cl::Option_*>,_128U> *)
             (Subs.super_SmallVectorStorage<std::pair<const_char_*,_llvm::cl::SubCommand_*>,_128U>.
              InlineElts[0x7f].super_AlignedCharArray<8UL,_16UL>.buffer + 8));
  sortOpts(&this_00->OptionsMap,
           (SmallVectorImpl<std::pair<const_char_*,_llvm::cl::Option_*>_> *)
           (Subs.super_SmallVectorStorage<std::pair<const_char_*,_llvm::cl::SubCommand_*>,_128U>.
            InlineElts[0x7f].super_AlignedCharArray<8UL,_16UL>.buffer + 8),
           (bool)(this->ShowHidden & 1));
  llvm::SmallVector<std::pair<const_char_*,_llvm::cl::SubCommand_*>,_128U>::SmallVector
            ((SmallVector<std::pair<const_char_*,_llvm::cl::SubCommand_*>,_128U> *)local_10a8);
  pCVar6 = llvm::
           ManagedStatic<(anonymous_namespace)::CommandLineParser,_llvm::object_creator<(anonymous_namespace)::CommandLineParser>,_llvm::object_deleter<(anonymous_namespace)::CommandLineParser>_>
           ::operator->(&GlobalParser);
  sortSubCommands(&(pCVar6->RegisteredSubCommands).super_SmallPtrSetImpl<llvm::cl::SubCommand_*>,
                  (SmallVectorImpl<std::pair<const_char_*,_llvm::cl::SubCommand_*>_> *)local_10a8);
  pCVar6 = llvm::
           ManagedStatic<(anonymous_namespace)::CommandLineParser,_llvm::object_creator<(anonymous_namespace)::CommandLineParser>,_llvm::object_deleter<(anonymous_namespace)::CommandLineParser>_>
           ::operator->(&GlobalParser);
  if ((pCVar6->ProgramOverview).Length != 0) {
    prVar7 = llvm::outs();
    prVar7 = llvm::raw_ostream::operator<<(prVar7,"OVERVIEW: ");
    pCVar6 = llvm::
             ManagedStatic<(anonymous_namespace)::CommandLineParser,_llvm::object_creator<(anonymous_namespace)::CommandLineParser>,_llvm::object_deleter<(anonymous_namespace)::CommandLineParser>_>
             ::operator->(&GlobalParser);
    local_10b8 = (pCVar6->ProgramOverview).Data;
    local_10b0 = (pCVar6->ProgramOverview).Length;
    prVar7 = llvm::raw_ostream::operator<<(prVar7,pCVar6->ProgramOverview);
    llvm::raw_ostream::operator<<(prVar7,"\n");
  }
  pSVar8 = llvm::
           ManagedStatic<llvm::cl::SubCommand,_llvm::object_creator<llvm::cl::SubCommand>,_llvm::object_deleter<llvm::cl::SubCommand>_>
           ::operator*((ManagedStatic<llvm::cl::SubCommand,_llvm::object_creator<llvm::cl::SubCommand>,_llvm::object_deleter<llvm::cl::SubCommand>_>
                        *)llvm::cl::TopLevelSubCommand);
  if (this_00 == pSVar8) {
    prVar7 = llvm::outs();
    prVar7 = llvm::raw_ostream::operator<<(prVar7,"USAGE: ");
    pCVar6 = llvm::
             ManagedStatic<(anonymous_namespace)::CommandLineParser,_llvm::object_creator<(anonymous_namespace)::CommandLineParser>,_llvm::object_deleter<(anonymous_namespace)::CommandLineParser>_>
             ::operator->(&GlobalParser);
    llvm::raw_ostream::operator<<(prVar7,&pCVar6->ProgramName);
    sVar9 = llvm::SmallVectorBase::size((SmallVectorBase *)local_10a8);
    if (2 < sVar9) {
      prVar7 = llvm::outs();
      llvm::raw_ostream::operator<<(prVar7," [subcommand]");
    }
    prVar7 = llvm::outs();
    llvm::raw_ostream::operator<<(prVar7," [options]");
  }
  else {
    local_10c8 = llvm::cl::SubCommand::getDescription(this_00);
    if (local_10c8.Length != 0) {
      prVar7 = llvm::outs();
      prVar7 = llvm::raw_ostream::operator<<(prVar7,"SUBCOMMAND \'");
      local_10d8 = llvm::cl::SubCommand::getName(this_00);
      prVar7 = llvm::raw_ostream::operator<<(prVar7,local_10d8);
      prVar7 = llvm::raw_ostream::operator<<(prVar7,"\': ");
      local_10e8 = llvm::cl::SubCommand::getDescription(this_00);
      prVar7 = llvm::raw_ostream::operator<<(prVar7,local_10e8);
      llvm::raw_ostream::operator<<(prVar7,"\n\n");
    }
    prVar7 = llvm::outs();
    prVar7 = llvm::raw_ostream::operator<<(prVar7,"USAGE: ");
    pCVar6 = llvm::
             ManagedStatic<(anonymous_namespace)::CommandLineParser,_llvm::object_creator<(anonymous_namespace)::CommandLineParser>,_llvm::object_deleter<(anonymous_namespace)::CommandLineParser>_>
             ::operator->(&GlobalParser);
    prVar7 = llvm::raw_ostream::operator<<(prVar7,&pCVar6->ProgramName);
    prVar7 = llvm::raw_ostream::operator<<(prVar7," ");
    ___range2 = llvm::cl::SubCommand::getName(this_00);
    prVar7 = llvm::raw_ostream::operator<<(prVar7,___range2);
    llvm::raw_ostream::operator<<(prVar7," [options]");
  }
  __end2 = (iterator)
           (this_01->super_SmallVectorImpl<llvm::cl::Option_*>).
           super_SmallVectorTemplateBase<llvm::cl::Option_*,_true>.
           super_SmallVectorTemplateCommon<llvm::cl::Option_*,_void>.super_SmallVectorBase.BeginX;
  pvVar2 = (this_01->super_SmallVectorImpl<llvm::cl::Option_*>).
           super_SmallVectorTemplateBase<llvm::cl::Option_*,_true>.
           super_SmallVectorTemplateCommon<llvm::cl::Option_*,_void>.super_SmallVectorBase.BeginX;
  __begin2 = (iterator)this_01;
  sVar9 = llvm::SmallVectorBase::size((SmallVectorBase *)this_01);
  Opt = (Option *)((long)pvVar2 + sVar9 * 8);
  for (; (Option *)__end2 != Opt; __end2 = __end2 + 1) {
    local_1118 = *__end2;
    bVar5 = llvm::cl::Option::hasArgStr(local_1118);
    if (bVar5) {
      prVar7 = llvm::outs();
      prVar7 = llvm::raw_ostream::operator<<(prVar7," --");
      local_1128 = (local_1118->ArgStr).Data;
      local_1120 = (local_1118->ArgStr).Length;
      llvm::raw_ostream::operator<<(prVar7,local_1118->ArgStr);
    }
    prVar7 = llvm::outs();
    prVar7 = llvm::raw_ostream::operator<<(prVar7," ");
    local_1138 = (local_1118->HelpStr).Data;
    local_1130 = (local_1118->HelpStr).Length;
    llvm::raw_ostream::operator<<(prVar7,local_1118->HelpStr);
  }
  if (this_00->ConsumeAfterOpt != (Option *)0x0) {
    prVar7 = llvm::outs();
    prVar7 = llvm::raw_ostream::operator<<(prVar7," ");
    pOVar3 = this_00->ConsumeAfterOpt;
    pSVar1 = &pOVar3->HelpStr;
    MaxSubLen = (size_t)pSVar1->Data;
    local_1140 = (pOVar3->HelpStr).Length;
    llvm::raw_ostream::operator<<(prVar7,*pSVar1);
  }
  pSVar8 = llvm::
           ManagedStatic<llvm::cl::SubCommand,_llvm::object_creator<llvm::cl::SubCommand>,_llvm::object_deleter<llvm::cl::SubCommand>_>
           ::operator*((ManagedStatic<llvm::cl::SubCommand,_llvm::object_creator<llvm::cl::SubCommand>,_llvm::object_deleter<llvm::cl::SubCommand>_>
                        *)llvm::cl::TopLevelSubCommand);
  if ((this_00 == pSVar8) &&
     (bVar5 = llvm::SmallVectorBase::empty((SmallVectorBase *)local_10a8), !bVar5)) {
    i = 0;
    e = 0;
    local_1160 = llvm::SmallVectorBase::size((SmallVectorBase *)local_10a8);
    for (; sVar9 = e, e != local_1160; e = e + 1) {
      sVar10 = llvm::SmallVectorBase::size((SmallVectorBase *)local_10a8);
      if (sVar10 <= sVar9) {
        __assert_fail("idx < size()",
                      "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/ADT/SmallVector.h"
                      ,0x9b,
                      "reference llvm::SmallVectorTemplateCommon<std::pair<const char *, llvm::cl::SubCommand *>>::operator[](size_type) [T = std::pair<const char *, llvm::cl::SubCommand *>]"
                     );
      }
      MaxArgLen = strlen(*(char **)((long)local_10a8 + sVar9 * 0x10));
      puVar11 = std::max<unsigned_long>(&i,&MaxArgLen);
      i = *puVar11;
    }
    prVar7 = llvm::outs();
    llvm::raw_ostream::operator<<(prVar7,"\n\n");
    prVar7 = llvm::outs();
    llvm::raw_ostream::operator<<(prVar7,"SUBCOMMANDS:\n\n");
    printSubCommands(this,(StrSubCommandPairVector *)local_10a8,i);
    prVar7 = llvm::outs();
    llvm::raw_ostream::operator<<(prVar7,"\n");
    prVar7 = llvm::outs();
    prVar7 = llvm::raw_ostream::operator<<(prVar7,"  Type \"");
    pCVar6 = llvm::
             ManagedStatic<(anonymous_namespace)::CommandLineParser,_llvm::object_creator<(anonymous_namespace)::CommandLineParser>,_llvm::object_deleter<(anonymous_namespace)::CommandLineParser>_>
             ::operator->(&GlobalParser);
    prVar7 = llvm::raw_ostream::operator<<(prVar7,&pCVar6->ProgramName);
    llvm::raw_ostream::operator<<
              (prVar7," <subcommand> -help\" to get more help on a specific subcommand");
  }
  prVar7 = llvm::outs();
  llvm::raw_ostream::operator<<(prVar7,"\n\n");
  i_1 = 0;
  e_1 = 0;
  local_1180 = llvm::SmallVectorBase::size
                         ((SmallVectorBase *)
                          (Subs.
                           super_SmallVectorStorage<std::pair<const_char_*,_llvm::cl::SubCommand_*>,_128U>
                           .InlineElts[0x7f].super_AlignedCharArray<8UL,_16UL>.buffer + 8));
  while( true ) {
    sVar9 = e_1;
    if (e_1 == local_1180) {
      prVar7 = llvm::outs();
      llvm::raw_ostream::operator<<(prVar7,"OPTIONS:\n");
      (**this->_vptr_HelpPrinter)
                (this,Subs.
                      super_SmallVectorStorage<std::pair<const_char_*,_llvm::cl::SubCommand_*>,_128U>
                      .InlineElts[0x7f].super_AlignedCharArray<8UL,_16UL>.buffer + 8,i_1);
      pCVar6 = llvm::
               ManagedStatic<(anonymous_namespace)::CommandLineParser,_llvm::object_creator<(anonymous_namespace)::CommandLineParser>,_llvm::object_deleter<(anonymous_namespace)::CommandLineParser>_>
               ::operator->(&GlobalParser);
      __end2_1 = std::vector<llvm::StringRef,_std::allocator<llvm::StringRef>_>::begin
                           (&pCVar6->MoreHelp);
      I.Length = (size_t)std::vector<llvm::StringRef,_std::allocator<llvm::StringRef>_>::end
                                   (&pCVar6->MoreHelp);
      while (bVar5 = __gnu_cxx::operator!=
                               (&__end2_1,
                                (__normal_iterator<llvm::StringRef_*,_std::vector<llvm::StringRef,_std::allocator<llvm::StringRef>_>_>
                                 *)&I.Length), bVar5) {
        pSVar12 = __gnu_cxx::
                  __normal_iterator<llvm::StringRef_*,_std::vector<llvm::StringRef,_std::allocator<llvm::StringRef>_>_>
                  ::operator*(&__end2_1);
        pcVar4 = pSVar12->Data;
        I.Data = (char *)pSVar12->Length;
        prVar7 = llvm::outs();
        Str.Length = (size_t)I.Data;
        Str.Data = pcVar4;
        llvm::raw_ostream::operator<<(prVar7,Str);
        __gnu_cxx::
        __normal_iterator<llvm::StringRef_*,_std::vector<llvm::StringRef,_std::allocator<llvm::StringRef>_>_>
        ::operator++(&__end2_1);
      }
      pCVar6 = llvm::
               ManagedStatic<(anonymous_namespace)::CommandLineParser,_llvm::object_creator<(anonymous_namespace)::CommandLineParser>,_llvm::object_deleter<(anonymous_namespace)::CommandLineParser>_>
               ::operator->(&GlobalParser);
      std::vector<llvm::StringRef,_std::allocator<llvm::StringRef>_>::clear(&pCVar6->MoreHelp);
      llvm::SmallVector<std::pair<const_char_*,_llvm::cl::SubCommand_*>,_128U>::~SmallVector
                ((SmallVector<std::pair<const_char_*,_llvm::cl::SubCommand_*>,_128U> *)local_10a8);
      llvm::SmallVector<std::pair<const_char_*,_llvm::cl::Option_*>,_128U>::~SmallVector
                ((SmallVector<std::pair<const_char_*,_llvm::cl::Option_*>,_128U> *)
                 (Subs.
                  super_SmallVectorStorage<std::pair<const_char_*,_llvm::cl::SubCommand_*>,_128U>.
                  InlineElts[0x7f].super_AlignedCharArray<8UL,_16UL>.buffer + 8));
      return;
    }
    sVar10 = llvm::SmallVectorBase::size
                       ((SmallVectorBase *)
                        (Subs.
                         super_SmallVectorStorage<std::pair<const_char_*,_llvm::cl::SubCommand_*>,_128U>
                         .InlineElts[0x7f].super_AlignedCharArray<8UL,_16UL>.buffer + 8));
    if (sVar10 <= sVar9) break;
    __range2_1 = (vector<llvm::StringRef,_std::allocator<llvm::StringRef>_> *)
                 (**(code **)(**(long **)(Subs.
                                          super_SmallVectorStorage<std::pair<const_char_*,_llvm::cl::SubCommand_*>,_128U>
                                          .InlineElts[0x7f].super_AlignedCharArray<8UL,_16UL>.buffer
                                          ._8_8_ + sVar9 * 0x10 + 8) + 0x28))();
    puVar11 = std::max<unsigned_long>(&i_1,(unsigned_long *)&__range2_1);
    i_1 = *puVar11;
    e_1 = e_1 + 1;
  }
  __assert_fail("idx < size()",
                "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/ADT/SmallVector.h"
                ,0x9b,
                "reference llvm::SmallVectorTemplateCommon<std::pair<const char *, llvm::cl::Option *>>::operator[](size_type) [T = std::pair<const char *, llvm::cl::Option *>]"
               );
}

Assistant:

void printHelp() {
    SubCommand *Sub = GlobalParser->getActiveSubCommand();
    auto &OptionsMap = Sub->OptionsMap;
    auto &PositionalOpts = Sub->PositionalOpts;
    auto &ConsumeAfterOpt = Sub->ConsumeAfterOpt;

    StrOptionPairVector Opts;
    sortOpts(OptionsMap, Opts, ShowHidden);

    StrSubCommandPairVector Subs;
    sortSubCommands(GlobalParser->RegisteredSubCommands, Subs);

    if (!GlobalParser->ProgramOverview.empty())
      outs() << "OVERVIEW: " << GlobalParser->ProgramOverview << "\n";

    if (Sub == &*TopLevelSubCommand) {
      outs() << "USAGE: " << GlobalParser->ProgramName;
      if (Subs.size() > 2)
        outs() << " [subcommand]";
      outs() << " [options]";
    } else {
      if (!Sub->getDescription().empty()) {
        outs() << "SUBCOMMAND '" << Sub->getName()
               << "': " << Sub->getDescription() << "\n\n";
      }
      outs() << "USAGE: " << GlobalParser->ProgramName << " " << Sub->getName()
             << " [options]";
    }

    for (auto Opt : PositionalOpts) {
      if (Opt->hasArgStr())
        outs() << " --" << Opt->ArgStr;
      outs() << " " << Opt->HelpStr;
    }

    // Print the consume after option info if it exists...
    if (ConsumeAfterOpt)
      outs() << " " << ConsumeAfterOpt->HelpStr;

    if (Sub == &*TopLevelSubCommand && !Subs.empty()) {
      // Compute the maximum subcommand length...
      size_t MaxSubLen = 0;
      for (size_t i = 0, e = Subs.size(); i != e; ++i)
        MaxSubLen = std::max(MaxSubLen, strlen(Subs[i].first));

      outs() << "\n\n";
      outs() << "SUBCOMMANDS:\n\n";
      printSubCommands(Subs, MaxSubLen);
      outs() << "\n";
      outs() << "  Type \"" << GlobalParser->ProgramName
             << " <subcommand> -help\" to get more help on a specific "
                "subcommand";
    }

    outs() << "\n\n";

    // Compute the maximum argument length...
    size_t MaxArgLen = 0;
    for (size_t i = 0, e = Opts.size(); i != e; ++i)
      MaxArgLen = std::max(MaxArgLen, Opts[i].second->getOptionWidth());

    outs() << "OPTIONS:\n";
    printOptions(Opts, MaxArgLen);

    // Print any extra help the user has declared.
    for (auto I : GlobalParser->MoreHelp)
      outs() << I;
    GlobalParser->MoreHelp.clear();
  }